

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_socket_buffer.hpp
# Opt level: O3

void libtorrent::aux::
     set_socket_buffer_size<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
               (basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *s,session_settings *sett,error_code *ec)

{
  implementation_type *piVar1;
  mutex *pmVar2;
  int iVar3;
  send_buffer_size option;
  error_code ignore;
  tcp_notsent_lowat local_44;
  undefined1 local_40 [8];
  error_category *local_38;
  
  pmVar2 = &sett->m_mutex;
  local_38 = (error_category *)((ulong)local_38 & 0xffffffffffffff00);
  local_40 = (undefined1  [8])pmVar2;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
  local_38 = (error_category *)CONCAT71(local_38._1_7_,1);
  iVar3 = (sett->m_store).m_ints._M_elems[0x85];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  if (iVar3 != 0) {
    local_40 = (undefined1  [8])((ulong)local_40 & 0xffffff0000000000);
    local_38 = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
    local_44.m_value = iVar3;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
    set_option<libtorrent::tcp_notsent_lowat>
              ((s->impl_).service_,&(s->impl_).implementation_,&local_44,(error_code *)local_40);
  }
  local_38 = (error_category *)((ulong)local_38 & 0xffffffffffffff00);
  local_40 = (undefined1  [8])pmVar2;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
  local_38 = (error_category *)CONCAT71(local_38._1_7_,1);
  iVar3 = (sett->m_store).m_ints._M_elems[0x3c];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  if (iVar3 != 0) {
    local_40 = (undefined1  [8])((ulong)local_40 & 0xffffffff00000000);
    piVar1 = &(s->impl_).implementation_;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
    get_option<boost::asio::detail::socket_option::integer<1,7>>
              ((s->impl_).service_,piVar1,(integer<1,_7> *)local_40,ec);
    if (((ec->failed_ == false) && (local_40._0_4_ != iVar3)) &&
       (local_44.m_value = iVar3,
       boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
       set_option<boost::asio::detail::socket_option::integer<1,7>>
                 ((s->impl_).service_,piVar1,(integer<1,_7> *)&local_44,ec), ec->failed_ == true)) {
      boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
      set_option<boost::asio::detail::socket_option::integer<1,7>>
                ((s->impl_).service_,piVar1,(integer<1,_7> *)local_40,ec);
      return;
    }
  }
  local_38 = (error_category *)((ulong)local_38 & 0xffffffffffffff00);
  local_40 = (undefined1  [8])pmVar2;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
  local_38 = (error_category *)CONCAT71(local_38._1_7_,true);
  iVar3 = (sett->m_store).m_ints._M_elems[0x3b];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  if (iVar3 != 0) {
    local_40 = (undefined1  [8])((ulong)local_40 & 0xffffffff00000000);
    piVar1 = &(s->impl_).implementation_;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
    get_option<boost::asio::detail::socket_option::integer<1,8>>
              ((s->impl_).service_,piVar1,(integer<1,_8> *)local_40,ec);
    if (((ec->failed_ == false) && (local_40._0_4_ != iVar3)) &&
       (local_44.m_value = iVar3,
       boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
       set_option<boost::asio::detail::socket_option::integer<1,8>>
                 ((s->impl_).service_,piVar1,(integer<1,_8> *)&local_44,ec), ec->failed_ == true)) {
      boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
      set_option<boost::asio::detail::socket_option::integer<1,8>>
                ((s->impl_).service_,piVar1,(integer<1,_8> *)local_40,ec);
    }
  }
  return;
}

Assistant:

void set_socket_buffer_size(Socket& s, session_settings const& sett, error_code& ec)
	{
#ifdef TCP_NOTSENT_LOWAT
		int const not_sent_low_watermark = sett.get_int(settings_pack::send_not_sent_low_watermark);
		if (not_sent_low_watermark)
		{
			error_code ignore;
			s.set_option(tcp_notsent_lowat(not_sent_low_watermark), ignore);
		}
#endif
		int const snd_size = sett.get_int(settings_pack::send_socket_buffer_size);
		if (snd_size)
		{
			typename Socket::send_buffer_size prev_option;
			s.get_option(prev_option, ec);
			if (!ec && prev_option.value() != snd_size)
			{
				typename Socket::send_buffer_size option(snd_size);
				s.set_option(option, ec);
				if (ec)
				{
					// restore previous value
					s.set_option(prev_option, ec);
					return;
				}
			}
		}
		int const recv_size = sett.get_int(settings_pack::recv_socket_buffer_size);
		if (recv_size)
		{
			typename Socket::receive_buffer_size prev_option;
			s.get_option(prev_option, ec);
			if (!ec && prev_option.value() != recv_size)
			{
				typename Socket::receive_buffer_size option(recv_size);
				s.set_option(option, ec);
				if (ec)
				{
					// restore previous value
					s.set_option(prev_option, ec);
					return;
				}
			}
		}
	}